

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int http_server_init(http_server_t *server,uint num_clients,uint max_clients,
                    http_client_callback_t *callback,int fd)

{
  uint __line;
  int iVar1;
  http_client_t *phVar2;
  long lVar3;
  char *pcVar4;
  
  if (server == (http_server_t *)0x0) {
    pcVar4 = "server != NULL";
    __line = 0x31;
  }
  else if (num_clients == 0) {
    pcVar4 = "num_clients > 0";
    __line = 0x32;
  }
  else {
    if (fd != -1) {
      server->num_clients = 0;
      server->max_clients = 0;
      server->callback = (http_client_callback_t *)0x0;
      server->fd = -1;
      phVar2 = (http_client_t *)malloc((ulong)num_clients * 0x2018);
      server->clients = phVar2;
      if (phVar2 == (http_client_t *)0x0) {
        iVar1 = 0;
      }
      else {
        server->num_clients = num_clients;
        server->max_clients = max_clients;
        server->callback = callback;
        for (lVar3 = 0; (ulong)num_clients * 0x2018 - lVar3 != 0; lVar3 = lVar3 + 0x2018) {
          pcVar4 = phVar2->buf + lVar3 + -0x10;
          pcVar4[0] = -1;
          pcVar4[1] = -1;
          pcVar4[2] = -1;
          pcVar4[3] = -1;
          pcVar4[4] = '\0';
          pcVar4[5] = '\0';
          pcVar4[6] = '\0';
          pcVar4[7] = '\0';
          pcVar4[8] = '\0';
          pcVar4[9] = '\0';
          pcVar4[10] = '\0';
          pcVar4[0xb] = '\0';
          pcVar4[0xc] = '\0';
          pcVar4[0xd] = '\0';
          pcVar4[0xe] = '\0';
          pcVar4[0xf] = '\0';
        }
        server->count_clients = 0;
        server->fd = fd;
        iVar1 = 1;
      }
      return iVar1;
    }
    pcVar4 = "fd != -1";
    __line = 0x33;
  }
  __assert_fail(pcVar4,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/http.c",__line
                ,
                "int http_server_init(http_server_t *, unsigned int, unsigned int, http_client_callback_t *, int)"
               );
}

Assistant:

int http_server_init(http_server_t *server,
                     unsigned int num_clients,
                     unsigned int max_clients,
                     http_client_callback_t *callback,
                     int fd) {
  assert(server != NULL);
  assert(num_clients > 0);
  assert(fd != -1);

  http_server_reset(server);
  server->clients = malloc(sizeof(http_client_t) * num_clients);
  if (server->clients == NULL)
    return 0;
  server->num_clients = num_clients;
  server->max_clients = max_clients;
  server->callback = callback;
  
  unsigned int i;
  for (i = 0; i < server->num_clients; i++) {
    http_client_init(server->clients + i);
  }
  server->count_clients = 0;
  server->fd = fd;

  return 1;
}